

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_Boolean UA_NodeId_equal(UA_NodeId *n1,UA_NodeId *n2)

{
  size_t __n;
  int iVar1;
  UA_Boolean UVar2;
  undefined1 auVar3 [16];
  
  if ((n1->namespaceIndex == n2->namespaceIndex) && (n1->identifierType == n2->identifierType)) {
    UVar2 = false;
    switch(n1->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
      UVar2 = (n1->identifier).numeric == (n2->identifier).numeric;
      break;
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
      __n = (n1->identifier).string.length;
      if (__n == (n2->identifier).string.length) {
        iVar1 = bcmp((n1->identifier).string.data,(n2->identifier).string.data,__n);
        return iVar1 == 0;
      }
      goto LAB_00110fd8;
    case UA_NODEIDTYPE_GUID:
      auVar3[0] = -(*(char *)&n2->identifier == *(char *)&n1->identifier);
      auVar3[1] = -(*(char *)((long)&n2->identifier + 1) == *(char *)((long)&n1->identifier + 1));
      auVar3[2] = -(*(char *)((long)&n2->identifier + 2) == *(char *)((long)&n1->identifier + 2));
      auVar3[3] = -(*(char *)((long)&n2->identifier + 3) == *(char *)((long)&n1->identifier + 3));
      auVar3[4] = -(*(char *)((long)&n2->identifier + 4) == *(char *)((long)&n1->identifier + 4));
      auVar3[5] = -(*(char *)((long)&n2->identifier + 5) == *(char *)((long)&n1->identifier + 5));
      auVar3[6] = -(*(char *)((long)&n2->identifier + 6) == *(char *)((long)&n1->identifier + 6));
      auVar3[7] = -(*(char *)((long)&n2->identifier + 7) == *(char *)((long)&n1->identifier + 7));
      auVar3[8] = -((n2->identifier).guid.data4[0] == (n1->identifier).guid.data4[0]);
      auVar3[9] = -((n2->identifier).guid.data4[1] == (n1->identifier).guid.data4[1]);
      auVar3[10] = -((n2->identifier).guid.data4[2] == (n1->identifier).guid.data4[2]);
      auVar3[0xb] = -((n2->identifier).guid.data4[3] == (n1->identifier).guid.data4[3]);
      auVar3[0xc] = -((n2->identifier).guid.data4[4] == (n1->identifier).guid.data4[4]);
      auVar3[0xd] = -((n2->identifier).guid.data4[5] == (n1->identifier).guid.data4[5]);
      auVar3[0xe] = -((n2->identifier).guid.data4[6] == (n1->identifier).guid.data4[6]);
      auVar3[0xf] = -((n2->identifier).guid.data4[7] == (n1->identifier).guid.data4[7]);
      UVar2 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
    }
  }
  else {
LAB_00110fd8:
    UVar2 = false;
  }
  return UVar2;
}

Assistant:

UA_Boolean
UA_NodeId_equal(const UA_NodeId *n1, const UA_NodeId *n2) {
    if(n1->namespaceIndex != n2->namespaceIndex ||
       n1->identifierType!=n2->identifierType)
        return false;
    switch(n1->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        if(n1->identifier.numeric == n2->identifier.numeric)
            return true;
        else
            return false;
    case UA_NODEIDTYPE_STRING:
        return UA_String_equal(&n1->identifier.string,
                               &n2->identifier.string);
    case UA_NODEIDTYPE_GUID:
        return UA_Guid_equal(&n1->identifier.guid,
                             &n2->identifier.guid);
    case UA_NODEIDTYPE_BYTESTRING:
        return UA_ByteString_equal(&n1->identifier.byteString,
                                   &n2->identifier.byteString);
    }
    return false;
}